

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void r4k_invalidate_tlb_mips64el(CPUMIPSState_conflict5 *env,int idx,int use_extra)

{
  CPUState *cpu;
  ulong *__src;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uint local_58;
  uint local_54;
  target_ulong mask;
  uint32_t tlb_mmid;
  _Bool mi;
  uint32_t MMID;
  uint16_t ASID;
  target_ulong end;
  target_ulong addr;
  r4k_tlb_t_conflict *tlb;
  CPUState *cs;
  int use_extra_local;
  int idx_local;
  CPUMIPSState_conflict5 *env_local;
  
  cpu = env_cpu(env);
  local_54 = env->CP0_MemoryMapID;
  bVar3 = (env->CP0_Config5 >> 0x11 & 1U) == 0;
  if (bVar3) {
    local_54 = (uint)(ushort)((ushort)env->CP0_EntryHi & (ushort)env->CP0_EntryHi_ASID_mask);
  }
  __src = (ulong *)((long)&env->tlb->mmu + (long)idx * 0x28);
  if (bVar3) {
    local_58 = (uint)*(ushort *)((long)__src + 0xc);
  }
  else {
    local_58 = (uint)__src[2];
  }
  if (((*(ushort *)((long)__src + 0x14) & 1) != 0) || (local_58 == local_54)) {
    if ((use_extra == 0) || (0x7f < env->tlb->tlb_in_use)) {
      uVar1 = (ulong)(uint)__src[1] | 0x1fff;
      if ((*(ushort *)((long)__src + 0x14) >> 7 & 1) != 0) {
        end = *__src & (uVar1 ^ 0xffffffffffffffff);
        if ((env->SEGMask & 0xffffffff80000000) <= end) {
          end = end | 0x3fffff0000000000;
        }
        uVar2 = end | uVar1 >> 1;
        for (; end < uVar2; end = end + 0x1000) {
          tlb_flush_page_mips64el(cpu,end);
        }
      }
      if ((*(ushort *)((long)__src + 0x14) >> 8 & 1) != 0) {
        end = *__src & (uVar1 ^ 0xffffffffffffffff) | (uVar1 >> 1) + 1;
        if ((env->SEGMask & 0xffffffff80000000) <= end) {
          end = end | 0x3fffff0000000000;
        }
        uVar1 = end | uVar1;
        for (; end - 1 < uVar1; end = end + 0x1000) {
          tlb_flush_page_mips64el(cpu,end);
        }
      }
    }
    else {
      memcpy((void *)((long)&env->tlb->mmu + (ulong)env->tlb->tlb_in_use * 0x28),__src,0x28);
      env->tlb->tlb_in_use = env->tlb->tlb_in_use + 1;
    }
  }
  return;
}

Assistant:

void r4k_invalidate_tlb(CPUMIPSState *env, int idx, int use_extra)
{
    CPUState *cs = env_cpu(env);
    r4k_tlb_t *tlb;
    target_ulong addr;
    target_ulong end;
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint32_t tlb_mmid;
    target_ulong mask;

    MMID = mi ? MMID : (uint32_t) ASID;

    tlb = &env->tlb->mmu.r4k.tlb[idx];
    /*
     * The qemu TLB is flushed when the ASID/MMID changes, so no need to
     * flush these entries again.
     */
    tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
    if (tlb->G == 0 && tlb_mmid != MMID) {
        return;
    }

    if (use_extra && env->tlb->tlb_in_use < MIPS_TLB_MAX) {
        /*
         * For tlbwr, we can shadow the discarded entry into
         * a new (fake) TLB entry, as long as the guest can not
         * tell that it's there.
         */
        env->tlb->mmu.r4k.tlb[env->tlb->tlb_in_use] = *tlb;
        env->tlb->tlb_in_use++;
        return;
    }

    /* 1k pages are not supported. */
    mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
    if (tlb->V0) {
        addr = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        if (addr >= (0xFFFFFFFF80000000ULL & env->SEGMask)) {
            addr |= 0x3FFFFF0000000000ULL;
        }
#endif
        end = addr | (mask >> 1);
        while (addr < end) {
            tlb_flush_page(cs, addr);
            addr += TARGET_PAGE_SIZE;
        }
    }
    if (tlb->V1) {
        addr = (tlb->VPN & ~mask) | ((mask >> 1) + 1);
#if defined(TARGET_MIPS64)
        if (addr >= (0xFFFFFFFF80000000ULL & env->SEGMask)) {
            addr |= 0x3FFFFF0000000000ULL;
        }
#endif
        end = addr | mask;
        while (addr - 1 < end) {
            tlb_flush_page(cs, addr);
            addr += TARGET_PAGE_SIZE;
        }
    }
}